

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall r_exec::CSTController::reduce(CSTController *this,View *input)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  Code *pCVar5;
  _Fact *this_00;
  Goal *this_01;
  undefined4 extraout_var;
  uint64_t uVar6;
  HLPBindingMap *pHVar7;
  Fact *super_goal;
  P *pPVar8;
  CSTOverlay *pCVar9;
  P<r_exec::Overlay> *this_02;
  Overlay *pOVar10;
  iterator iVar11;
  const_iterator cVar12;
  const_iterator local_c0;
  P<r_exec::Overlay> local_b0;
  const_iterator local_a8;
  const_iterator local_98;
  iterator local_88;
  iterator local_78;
  uint64_t local_68;
  uint64_t now;
  lock_guard<std::mutex> guard;
  const_iterator o;
  CSTOverlay *offspring;
  bool match;
  P<r_exec::HLPBindingMap> local_30;
  P<r_exec::HLPBindingMap> bm;
  _Fact *goal_target;
  Goal *goal;
  View *input_local;
  CSTController *this_local;
  
  bVar1 = HLPController::is_orphan(&this->super_HLPController);
  if (!bVar1) {
    pCVar5 = core::P<r_code::Code>::operator->(&(input->super_View).object);
    uVar3 = (*(pCVar5->super__Object)._vptr__Object[0xe])();
    if ((uVar3 & 1) == 0) {
      this_00 = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
      this_01 = _Fact::get_goal(this_00);
      if (((this_01 == (Goal *)0x0) || (bVar1 = Goal::is_self_goal(this_01), !bVar1)) ||
         (bVar1 = Goal::is_drive(this_01), bVar1)) {
        offspring._3_1_ = false;
        r_code::list<core::P<r_exec::Overlay>_>::const_iterator::const_iterator
                  ((const_iterator *)&guard);
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)&now,
                   &(this->super_HLPController).super_OController.super_Controller.m_reductionMutex)
        ;
        local_68 = (*Now)();
        local_78 = r_code::list<core::P<r_exec::Overlay>_>::begin
                             (&(this->super_HLPController).super_OController.overlays);
        r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
                  ((const_iterator *)&guard,&local_78);
        while( true ) {
          iVar11 = r_code::list<core::P<r_exec::Overlay>_>::end
                             (&(this->super_HLPController).super_OController.overlays);
          local_88 = iVar11;
          bVar1 = r_code::list<core::P<r_exec::Overlay>_>::_iterator::operator!=
                            ((_iterator *)&guard,&local_88.super__iterator);
          if (!bVar1) break;
          pPVar8 = (P *)r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                                  ((const_iterator *)&guard);
          pCVar9 = core::P::operator_cast_to_CSTOverlay_(pPVar8);
          bVar1 = CSTOverlay::can_match(pCVar9,local_68);
          if (bVar1) {
            this_02 = r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                                ((const_iterator *)&guard);
            pOVar10 = core::P<r_exec::Overlay>::operator->(this_02);
            uVar3 = (*(pOVar10->super__Object)._vptr__Object[4])();
            if ((uVar3 & 1) == 0) {
              pPVar8 = (P *)r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                                      ((const_iterator *)&guard);
              pCVar9 = core::P::operator_cast_to_CSTOverlay_(pPVar8);
              offspring._3_1_ = CSTOverlay::reduce(pCVar9,input,(CSTOverlay **)&o._list);
              if (o._list == (list<core::P<r_exec::Overlay>_> *)0x0) {
                if (offspring._3_1_) {
                  cVar12 = r_code::list<core::P<r_exec::Overlay>_>::erase
                                     (&(this->super_HLPController).super_OController.overlays,
                                      (const_iterator *)&guard);
                  local_c0 = cVar12;
                  r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
                            ((const_iterator *)&guard,&local_c0);
                }
                else {
                  r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator++
                            ((const_iterator *)&guard);
                }
              }
              else {
                core::P<r_exec::Overlay>::P(&local_b0,(Overlay *)o._list);
                r_code::list<core::P<r_exec::Overlay>_>::push_front
                          (&(this->super_HLPController).super_OController.overlays,&local_b0);
                core::P<r_exec::Overlay>::~P(&local_b0);
              }
            }
            else {
              cVar12 = r_code::list<core::P<r_exec::Overlay>_>::erase
                                 (&(this->super_HLPController).super_OController.overlays,
                                  (const_iterator *)&guard);
              local_a8 = cVar12;
              r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
                        ((const_iterator *)&guard,&local_a8);
            }
          }
          else {
            cVar12 = r_code::list<core::P<r_exec::Overlay>_>::erase
                               (&(this->super_HLPController).super_OController.overlays,
                                (const_iterator *)&guard);
            local_98 = cVar12;
            r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
                      ((const_iterator *)&guard,&local_98);
          }
        }
        (*(this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
          [8])(this,(ulong)offspring._3_1_);
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&now);
      }
      else {
        bm.object = (_Object *)Goal::get_target(this_01);
        (*(((LObject *)&(bm.object)->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>)
          .super_LObject.super_Code.super__Object._vptr__Object[4])(bm.object,0);
        sVar2 = r_code::Atom::asOpcode();
        if (sVar2 == Opcodes::ICst) {
          iVar4 = (*(bm.object)->_vptr__Object[9])(bm.object,0);
          pCVar5 = Controller::getObject((Controller *)this);
          if (((Code *)CONCAT44(extraout_var,iVar4) == pCVar5) &&
             (uVar6 = HLPController::get_requirement_count(&this->super_HLPController), uVar6 == 0))
          {
            pHVar7 = (HLPBindingMap *)operator_new(0x40);
            HLPBindingMap::HLPBindingMap(pHVar7);
            core::P<r_exec::HLPBindingMap>::P(&local_30,pHVar7);
            pHVar7 = core::P<r_exec::HLPBindingMap>::operator->(&local_30);
            HLPBindingMap::init_from_f_ihlp(pHVar7,(_Fact *)bm.object);
            pHVar7 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_30);
            bVar1 = HLPController::evaluate_bwd_guards(&this->super_HLPController,pHVar7);
            if (bVar1) {
              pHVar7 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_30);
              super_goal = core::P::operator_cast_to_Fact_((P *)&(input->super_View).object);
              abduce(this,pHVar7,super_goal);
            }
            core::P<r_exec::HLPBindingMap>::~P(&local_30);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CSTController::reduce(r_exec::View *input)
{
    if (is_orphan()) {
        return;
    }

    if (input->object->is_invalidated()) {
        return;
    }

    Goal *goal = ((_Fact *)input->object)->get_goal();

    if (goal && goal->is_self_goal() && !goal->is_drive()) { // goal is g->f->target.
        _Fact *goal_target = goal->get_target(); // handle only icst.

        if (goal_target->code(0).asOpcode() == Opcodes::ICst && goal_target->get_reference(0) == getObject()) { // f is f->icst; produce as many sub-goals as there are patterns in the cst.
            if (!get_requirement_count()) { // models will attempt to produce the icst
                P<HLPBindingMap> bm = new HLPBindingMap;
                bm->init_from_f_ihlp(goal_target);

                if (evaluate_bwd_guards(bm)) { // leaves the controller constant: no need to protect; bm may be updated.
                    abduce(bm, input->object);
                }
            }
        }
    } else {
        // std::cout<<"CTRL: "<<get_host()->get_oid()<<" > "<<input->object->get_oid()<<std::endl;
        bool match = false;
        CSTOverlay *offspring;
        r_code::list<P<Overlay> >::const_iterator o;
        std::lock_guard<std::mutex> guard(m_reductionMutex);
        uint64_t now = Now();

        for (o = overlays.begin(); o != overlays.end();) {
            if (!((CSTOverlay *)*o)->can_match(now)) {
                o = overlays.erase(o);
            } else if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                match = ((CSTOverlay *)*o)->reduce(input, offspring);

                if (offspring) {
                    overlays.push_front(offspring);
                } else if (match) { // full match: no offspring.
                    o = overlays.erase(o);
                } else {
                    ++o;
                }
            }
        }

        check_last_match_time(match);
    }
}